

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

int __thiscall xmrig::Client::connect(Client *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  int iVar2;
  Client *client;
  String *in_stack_fffffffffffffff0;
  Client *this_00;
  
  this_00 = this;
  bVar1 = Pool::isTLS((Pool *)0x1bf77f);
  if (bVar1) {
    client = (Client *)operator_new(0x878);
    Tls::Tls((Tls *)this,client);
    this->m_tls = (Tls *)client;
  }
  Pool::host((Pool *)0x1bf7e1);
  iVar2 = resolve(this_00,in_stack_fffffffffffffff0);
  return iVar2;
}

Assistant:

void xmrig::Client::connect()
{
#   ifdef XMRIG_FEATURE_TLS
    if (m_pool.isTLS()) {
        m_tls = new Tls(this);
    }
#   endif

    resolve(m_pool.host());
}